

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *src,assign_op<double,_double> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  plainobjectbase_evaluator_data<double,_0> local_78;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_70;
  SrcEvaluatorType local_50;
  
  local_50.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
       (((src->m_lhs).m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
       m_storage.m_data;
  local_50.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  .m_functor.m_other = (src->m_lhs).m_rhs.m_functor.m_other;
  local_50.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  .m_functor.m_other = (src->m_rhs).m_functor.m_other;
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>,double,double>
            (dst,src,func);
  local_78.data =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_70.m_dst = (DstEvaluatorType *)&local_78;
  local_70.m_src = &local_50;
  local_70.m_functor = func;
  local_70.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run(&local_70);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}